

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recvfrom_op.hpp
# Opt level: O0

void __thiscall
asio::detail::
reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
::reactive_socket_recvfrom_op_base
          (reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
           *this,socket_type socket,int protocol_type,mutable_buffers_1 *buffers,
          basic_endpoint<asio::ip::udp> *endpoint,message_flags flags,func_type complete_func)

{
  undefined8 *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  func_type in_RDI;
  reactor_op *in_R8;
  undefined4 in_R9D;
  undefined4 in_stack_ffffffffffffffd8;
  
  reactor_op::reactor_op(in_R8,(perform_func_type)CONCAT44(in_R9D,in_stack_ffffffffffffffd8),in_RDI)
  ;
  *(undefined4 *)(in_RDI + 0x38) = in_ESI;
  *(undefined4 *)(in_RDI + 0x3c) = in_EDX;
  *(undefined8 *)(in_RDI + 0x40) = *in_RCX;
  *(undefined8 *)(in_RDI + 0x48) = in_RCX[1];
  *(reactor_op **)(in_RDI + 0x50) = in_R8;
  *(undefined4 *)(in_RDI + 0x58) = in_R9D;
  return;
}

Assistant:

reactive_socket_recvfrom_op_base(socket_type socket, int protocol_type,
      const MutableBufferSequence& buffers, Endpoint& endpoint,
      socket_base::message_flags flags, func_type complete_func)
    : reactor_op(&reactive_socket_recvfrom_op_base::do_perform, complete_func),
      socket_(socket),
      protocol_type_(protocol_type),
      buffers_(buffers),
      sender_endpoint_(endpoint),
      flags_(flags)
  {
  }